

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O1

int __thiscall InvertDatabase::make_l1_pass(InvertDatabase *this)

{
  int *piVar1;
  Env *this_00;
  pointer piVar2;
  Partition *this_01;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  uint supsz;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  Env *this_03;
  long lVar9;
  long lVar10;
  int ivalsz;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> ival;
  undefined1 local_81;
  int local_80;
  uint local_7c;
  vector<int,_std::allocator<int>_> *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  vint *local_68;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_60;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_50;
  ostream *local_40;
  vint *local_38;
  
  this_00 = this->env;
  local_68 = &this->backidx;
  std::vector<int,_std::allocator<int>_>::resize(local_68,100);
  local_38 = &this->fidx;
  std::vector<int,_std::allocator<int>_>::resize
            (local_38,(long)((this->args).
                             super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->dbase_max_item);
  this->numfreq = 0;
  local_7c = 100;
  local_78 = (vector<int,_std::allocator<int>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,int&>
            (&_Stack_70,&local_78,(allocator<std::vector<int,_std::allocator<int>_>_> *)&local_81,
             (int *)&local_7c);
  if (0 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          dbase_max_item) {
    local_40 = (ostream *)&this_00->idlstrm;
    local_80 = 100;
    lVar8 = 0;
    do {
      iVar5 = (int)lVar8;
      supsz = Partition::partition_get_idxsup
                        ((this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,iVar5);
      if ((int)local_7c < (int)supsz) {
        local_7c = supsz;
        std::vector<int,_std::allocator<int>_>::resize(local_78,(long)(int)supsz);
      }
      piVar2 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      this_01 = (this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_78;
      local_50.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_70._M_pi;
      if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
        }
      }
      Partition::partition_read_item(this_01,&local_50,iVar5);
      if (local_50.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      lVar9 = 0;
      while( true ) {
        iVar4 = ClassInfo::get_num_class
                          ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (iVar4 <= lVar9) break;
        (((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tmpe).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar9] = 0;
        lVar9 = lVar9 + 1;
      }
      if (0 < (int)supsz) {
        peVar3 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar4 = -1;
        uVar7 = 0;
        do {
          if (iVar4 != piVar2[uVar7]) {
            if (peVar3->has_class == true) {
              lVar9 = (long)(peVar3->classes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7];
            }
            else {
              lVar9 = 0;
            }
            piVar1 = (peVar3->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9;
            *piVar1 = *piVar1 + 1;
          }
          iVar4 = piVar2[uVar7];
          uVar7 = uVar7 + 2;
        } while (uVar7 < supsz);
      }
      (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = -1;
      lVar9 = 0;
      do {
        lVar10 = lVar9;
        iVar4 = ClassInfo::get_num_class
                          ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (iVar4 <= lVar10) goto LAB_001195fd;
        peVar3 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar9 = lVar10 + 1;
      } while ((peVar3->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10] <
               (peVar3->min_supports).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10]);
      if (local_80 <= this->numfreq) {
        local_80 = local_80 * 2;
        std::vector<int,_std::allocator<int>_>::resize(local_68,(long)local_80);
      }
      (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[this->numfreq] = iVar5;
      (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = this->numfreq;
      this->numfreq = this->numfreq + 1;
LAB_001195fd:
      if (lVar10 < iVar4) {
        lVar10 = 0;
        lVar9 = 0;
        while( true ) {
          iVar4 = ClassInfo::get_num_class
                            ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (iVar4 <= lVar9) break;
          Array::add((Array *)((long)&(((this->itsup).
                                        super__Vector_base<Array,_std::allocator<Array>_>._M_impl.
                                        super__Vector_impl_data._M_start)->theArray).
                                      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar10),
                     (((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9]);
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x18;
        }
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outputfreq != '\0') {
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)this_00,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," --",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
          iVar5 = get_sup(this,iVar5,-1);
          std::ostream::operator<<((ostream *)this_00,iVar5);
          lVar9 = 0;
          while( true ) {
            iVar5 = ClassInfo::get_num_class
                              ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
            if (iVar5 <= lVar9) break;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
            std::ostream::operator<<
                      ((ostream *)this_00,
                       (((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9]);
            lVar9 = lVar9 + 1;
          }
          this_03 = this_00;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
          if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              print_tidlist != '\0') {
            local_60.
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_78;
            local_60.
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = _Stack_70._M_pi;
            if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
              }
            }
            print_idlist((InvertDatabase *)this_03,local_40,&local_60,supsz);
            if (local_60.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.
                         super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
          std::ostream::put((char)this_00);
          std::ostream::flush();
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->dbase_max_item);
  }
  std::vector<int,_std::allocator<int>_>::resize(local_68,(long)this->numfreq);
  this_02._M_pi = _Stack_70._M_pi;
  local_78 = (vector<int,_std::allocator<int>_> *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
  }
  iVar5 = this->numfreq;
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  return iVar5;
}

Assistant:

int InvertDatabase::make_l1_pass() {
    int i, j;
    int supsz;
    int bsz = 100;

    ostringstream &seqstrm = env.seqstrm;
    ostringstream &idlstrm = env.idlstrm;

    backidx.resize(bsz);
    fidx.resize(args->dbase_max_item);

    numfreq = 0;
    int ivalsz = 100;
    shared_ptr<vint> ival = make_shared<vint>(ivalsz);
//   int tt=0;
    for (i = 0; i < args->dbase_max_item; i++) {
        supsz = partition->partition_get_idxsup(i);
        if (ivalsz < supsz) {
            ivalsz = supsz;
            ival->resize(ivalsz);
        }
        int *ival_data = ival->data();
        partition->partition_read_item(ival, i);
        for (j = 0; j < cls->get_num_class(); j++) {
            cls->set_tmpe_item(j, 0);
        }

        int cid = -1;
        for (j = 0; j < supsz; j += 2) {
            if (cid != ival_data[j]) {
                cls->increase_tmpe(j);
            }
            cid = ival_data[j];
        }

        char lflg = 0;
        fidx[i] = -1;       // default init
        for (j = 0; j < cls->get_num_class(); j++) {
            if (cls->strong_esupport(j)) {
                lflg = 1;
                if (numfreq + 1 > bsz) {
                    bsz = 2 * bsz;
                    backidx.resize(bsz);
                }
                backidx[numfreq] = i;
                fidx[i] = numfreq;
                //   cls->TMPE[j] << endl;
                numfreq++;
                break;
            }
        }

        if (lflg) {
            for (j = 0; j < cls->get_num_class(); j++)
                add_sup(cls->get_tmpe_item(j), j);
            if (args->outputfreq) {
                seqstrm << i << " --";
                seqstrm << " " << get_sup(i);
                for (j = 0; j < cls->get_num_class(); j++)
                    seqstrm << " " << cls->get_tmpe_item(j);
                seqstrm << " ";
                if (args->print_tidlist) print_idlist(idlstrm, ival, supsz);
                seqstrm << endl;
            }
        }
    }

    backidx.resize(numfreq);
    ival = nullptr;

    return numfreq;
}